

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O3

_Bool Hacl_RSAPSS_rsapss_sign
                (Spec_Hash_Definitions_hash_alg a,uint32_t modBits,uint32_t eBits,uint32_t dBits,
                uint64_t *skey,uint32_t saltLen,uint8_t *salt,uint32_t msgLen,uint8_t *msg,
                uint8_t *sgnt)

{
  uint64_t b;
  long lVar1;
  Spec_Hash_Definitions_hash_alg a_00;
  uint32_t uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint32_t i_1;
  uint uVar5;
  uint64_t uVar6;
  ulong uVar7;
  void *pvVar8;
  undefined4 in_register_00000014;
  void *extraout_RDX;
  ulong *extraout_RDX_00;
  uint8_t *puVar9;
  void *pvVar10;
  byte *__s;
  ulong *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  undefined4 in_register_00000034;
  int iVar14;
  undefined7 in_register_00000039;
  uint64_t *puVar15;
  undefined4 in_register_0000008c;
  uint uVar16;
  uint uVar17;
  ulong unaff_R12;
  byte *res;
  uint emBits;
  uint64_t *a_01;
  ulong uVar18;
  uint8_t *input;
  uint32_t i;
  uint uVar19;
  ulong uVar20;
  undefined8 uStack_128;
  uint8_t auStack_120 [8];
  void *pvStack_118;
  ulong uStack_108;
  undefined1 auStack_d8 [4];
  uint uStack_d4;
  ulong uStack_d0;
  void *pvStack_c8;
  uint8_t *puStack_c0;
  uint64_t *puStack_b8;
  uint32_t uStack_ac;
  code *pcStack_80;
  void *local_78 [2];
  uint64_t *local_68;
  uint32_t local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  uint64_t *local_40;
  uint64_t *local_38;
  ulong __n;
  
  uVar7 = CONCAT44(in_register_0000008c,saltLen);
  uVar18 = CONCAT71(in_register_00000039,a);
  pvVar8 = (void *)CONCAT44(in_register_00000034,modBits);
  local_78[0] = local_78;
  if (a < 0xc) {
    local_50 = (ulong)a;
    if (saltLen <= -*(int *)(&DAT_001dbf54 + local_50 * 4) - 9U) {
      uVar16 = modBits - 2 >> 3;
      uVar17 = uVar16 + 1;
      if (*(int *)(&DAT_001dbf54 + local_50 * 4) + saltLen + 2 <= uVar17) {
        emBits = modBits - 1;
        uVar5 = emBits >> 6;
        uVar19 = uVar5 + 1;
        local_38 = (uint64_t *)(ulong)(uVar5 * 8 + 0x17 & 0xfffffff0);
        puVar15 = (uint64_t *)((long)local_78 + -(long)local_38);
        uVar18 = (ulong)(uVar5 * 8 + 8);
        uVar20 = 0;
        local_78[1] = (void *)CONCAT44(in_register_00000014,eBits);
        local_68 = puVar15;
        local_5c = dBits;
        local_58 = uVar18;
        local_48 = uVar7;
        local_40 = skey;
        *(undefined8 *)((long)&pcStack_80 + -(long)local_38) = 0x165118;
        memset(puVar15,0,uVar18);
        puVar9 = (uint8_t *)((long)puVar15 - (ulong)(uVar16 + 0x10 & 0xfffffff0));
        puVar9[-8] = '6';
        puVar9[-7] = 'Q';
        puVar9[-6] = '\x16';
        puVar9[-5] = '\0';
        puVar9[-4] = '\0';
        puVar9[-3] = '\0';
        puVar9[-2] = '\0';
        puVar9[-1] = '\0';
        memset(puVar9,0,(ulong)uVar17);
        uVar7 = local_48;
        uVar18 = local_50;
        *(uint8_t **)(puVar9 + -0x10) = puVar9;
        puVar9[-0x18] = 'V';
        puVar9[-0x17] = 'Q';
        puVar9[-0x16] = '\x16';
        puVar9[-0x15] = '\0';
        puVar9[-0x14] = '\0';
        puVar9[-0x13] = '\0';
        puVar9[-0x12] = '\0';
        puVar9[-0x11] = '\0';
        pss_encode((Spec_Hash_Definitions_hash_alg)uVar18,(uint32_t)uVar7,salt,msgLen,msg,emBits,
                   *(uint8_t **)(puVar9 + -0x10));
        puVar15 = local_68;
        puVar9[-8] = 'i';
        puVar9[-7] = 'Q';
        puVar9[-6] = '\x16';
        puVar9[-5] = '\0';
        puVar9[-4] = '\0';
        puVar9[-3] = '\0';
        puVar9[-2] = '\0';
        puVar9[-1] = '\0';
        Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar17,puVar9,puVar15);
        uVar18 = local_58;
        local_50 = (ulong)(emBits >> 3);
        a_01 = (uint64_t *)(puVar9 + -(long)local_38);
        a_01[-1] = 0x16518c;
        memset(a_01,0,uVar18);
        pvVar10 = (void *)((long)a_01 - (long)local_38);
        *(undefined8 *)((long)pvVar10 + -8) = 0x1651a3;
        memset(pvVar10,0,uVar18);
        puVar3 = local_40;
        local_38 = (uint64_t *)((long)local_40 + uVar18);
        local_58 = uVar18 + (long)local_38;
        local_48 = local_58 + (ulong)((int)local_78[1] - 1U >> 6) * 8 + 8;
        uVar6 = *local_40;
        *(undefined8 *)((long)pvVar10 + -8) = 0x1651d7;
        uVar6 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar6);
        puVar4 = local_38;
        uVar2 = local_5c;
        puVar15 = local_68;
        *(uint64_t **)((long)pvVar10 + -8) = a_01;
        *(ulong *)((long)pvVar10 + -0x10) = local_48;
        *(undefined8 *)((long)pvVar10 + -0x18) = 0x1651f9;
        Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
                  (uVar19,puVar3,uVar6,puVar4,puVar15,uVar2,*(uint64_t **)((long)pvVar10 + -0x10),
                   *(uint64_t **)((long)pvVar10 + -8));
        uVar6 = *local_40;
        *(undefined8 *)((long)pvVar10 + -8) = 0x165209;
        uVar6 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar6);
        puVar4 = local_38;
        puVar3 = local_40;
        pvVar8 = local_78[1];
        local_40 = a_01;
        *(void **)((long)pvVar10 + -8) = pvVar10;
        *(ulong *)((long)pvVar10 + -0x10) = local_58;
        *(undefined8 *)((long)pvVar10 + -0x18) = 0x16522b;
        Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64
                  (uVar19,puVar3,uVar6,puVar4,a_01,(uint32_t)pvVar8,
                   *(uint64_t **)((long)pvVar10 + -0x10),*(uint64_t **)((long)pvVar10 + -8));
        uVar18 = 0xffffffffffffffff;
        do {
          uVar6 = puVar15[uVar20];
          b = *(uint64_t *)((long)pvVar10 + uVar20 * 8);
          *(undefined8 *)((long)pvVar10 + -8) = 0x165243;
          uVar6 = FStar_UInt64_eq_mask(uVar6,b);
          puVar3 = local_40;
          uVar18 = uVar18 & uVar6;
          uVar20 = uVar20 + 1;
        } while (uVar19 != uVar20);
        uVar7 = 0;
        do {
          local_40[uVar7] = local_40[uVar7] & uVar18;
          uVar7 = uVar7 + 1;
        } while (uVar19 != uVar7);
        iVar14 = (int)local_50;
        *(undefined8 *)((long)pvVar10 + -8) = 0x165276;
        Hacl_Bignum_Convert_bn_to_bytes_be_uint64(iVar14 + 1,puVar3,sgnt);
        return uVar18 == 0xffffffffffffffff;
      }
    }
    return false;
  }
  pcStack_80 = pss_encode;
  Hacl_RSAPSS_rsapss_sign_cold_1();
  uVar16 = (uint)uVar18;
  pcStack_80 = (code *)&stack0xfffffffffffffff8;
  if (0xb < uVar16) {
LAB_00165563:
    pss_encode_cold_2();
    uVar17 = uVar16 - 1 & 0xfffffff8;
    uVar7 = (ulong)uVar17;
    uVar18 = (ulong)(uVar17 + 8);
    lVar1 = -(uVar18 + 0xf & 0xfffffffffffffff0);
    pvVar10 = (void *)((long)&pvStack_118 + lVar1);
    puVar12 = auStack_120 + lVar1;
    pvStack_118 = pvVar8;
    uStack_108 = unaff_R12;
    puVar12[0] = 0xab;
    puVar12[1] = 'U';
    puVar12[2] = '\x16';
    puVar12[3] = '\0';
    puVar12[4] = '\0';
    puVar12[5] = '\0';
    puVar12[6] = '\0';
    puVar12[7] = '\0';
    memset(pvVar10,0,uVar18);
    pvVar8 = pvStack_118;
    puVar13 = auStack_120 + lVar1;
    puVar13[0] = 0xc0;
    puVar13[1] = 'U';
    puVar13[2] = '\x16';
    puVar13[3] = '\0';
    puVar13[4] = '\0';
    puVar13[5] = '\0';
    puVar13[6] = '\0';
    puVar13[7] = '\0';
    memcpy((void *)((long)pvVar10 + (uVar18 - uVar16)),pvVar8,(ulong)uVar16);
    puVar11 = extraout_RDX_00;
    do {
      uVar18 = *(ulong *)((long)pvVar10 + (uVar7 & 0xffffffff));
      *puVar11 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                 (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                 (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                 (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
      uVar7 = uVar7 - 8;
      puVar11 = puVar11 + 1;
    } while (uVar7 != 0xfffffffffffffff8);
    return SUB81(uVar18 >> 0x38,0);
  }
  unaff_R12 = (ulong)pvVar8 & 0xffffffff;
  uVar17 = (uint)pvVar8;
  uStack_d4 = uVar16;
  uStack_d0 = unaff_R12;
  pvStack_c8 = extraout_RDX;
  puStack_b8 = skey;
  uStack_ac = dBits;
  switch(uVar18 & 0xffffffff) {
  default:
    pcStack_80 = (code *)&stack0xfffffffffffffff8;
    pss_encode_cold_1();
    goto LAB_00165563;
  case 1:
    puStack_c0 = &stack0xffffffffffffff00;
    uVar16 = uVar17 + 0x28;
    uVar18 = (ulong)uVar16 + 0xf & 0xfffffffffffffff0;
    lVar1 = -uVar18;
    input = puStack_c0 + lVar1;
    pcStack_80 = (code *)&stack0xfffffffffffffff8;
    *(undefined8 *)((long)&uStack_108 + lVar1) = 0x165310;
    memset(input,0,(ulong)uVar16);
    uVar2 = uStack_ac;
    puVar15 = puStack_b8;
    *(undefined8 *)((long)&uStack_108 + lVar1) = 0x165327;
    Hacl_Hash_SHA2_hash_256(auStack_d8 + (-0x20 - uVar18),(uint8_t *)puVar15,uVar2);
    pvVar8 = pvStack_c8;
    *(undefined8 *)((long)&uStack_108 + lVar1) = 0x16533b;
    memcpy(auStack_d8 + lVar1,pvVar8,unaff_R12);
    puVar9 = puStack_c0;
    *(undefined8 *)((long)&uStack_108 + lVar1) = 0x165349;
    Hacl_Hash_SHA2_hash_256(puVar9,input,uVar16);
    puStack_b8 = (uint64_t *)0x20;
    uStack_ac = 0x20;
    break;
  case 2:
    puStack_c0 = &stack0xfffffffffffffef0;
    uStack_108 = 0;
    uVar16 = uVar17 + 0x38;
    uVar18 = (ulong)uVar16 + 0xf & 0xfffffffffffffff0;
    lVar1 = -uVar18;
    input = puStack_c0 + lVar1;
    pcStack_80 = (code *)&stack0xfffffffffffffff8;
    *(undefined8 *)((long)&pvStack_118 + lVar1) = 0x165432;
    memset(input,0,(ulong)uVar16);
    uVar2 = uStack_ac;
    puVar15 = puStack_b8;
    *(undefined8 *)((long)&pvStack_118 + lVar1) = 0x165449;
    Hacl_Hash_SHA2_hash_384((uint8_t *)((long)&uStack_108 - uVar18),(uint8_t *)puVar15,uVar2);
    pvVar8 = pvStack_c8;
    *(undefined8 *)((long)&pvStack_118 + lVar1) = 0x16545d;
    memcpy(auStack_d8 + lVar1,pvVar8,unaff_R12);
    puVar9 = puStack_c0;
    *(undefined8 *)((long)&pvStack_118 + lVar1) = 0x16546b;
    Hacl_Hash_SHA2_hash_384(puVar9,input,uVar16);
    puStack_b8 = (uint64_t *)0x30;
    uStack_ac = 0x30;
    break;
  case 3:
    puStack_c0 = auStack_120;
    uStack_108 = 0;
    auStack_120[0] = '\0';
    auStack_120[1] = '\0';
    auStack_120[2] = '\0';
    auStack_120[3] = '\0';
    auStack_120[4] = '\0';
    auStack_120[5] = '\0';
    auStack_120[6] = '\0';
    auStack_120[7] = '\0';
    pvStack_118 = (void *)0x0;
    uVar16 = uVar17 + 0x48;
    uVar18 = (ulong)uVar16 + 0xf & 0xfffffffffffffff0;
    lVar1 = -uVar18;
    input = puStack_c0 + lVar1;
    pcStack_80 = (code *)&stack0xfffffffffffffff8;
    *(undefined8 *)((long)&uStack_128 + lVar1) = 0x1653a3;
    memset(input,0,(ulong)uVar16);
    uVar2 = uStack_ac;
    puVar15 = puStack_b8;
    *(undefined8 *)((long)&uStack_128 + lVar1) = 0x1653ba;
    Hacl_Hash_SHA2_hash_512((uint8_t *)((long)&pvStack_118 - uVar18),(uint8_t *)puVar15,uVar2);
    pvVar8 = pvStack_c8;
    *(undefined8 *)((long)&uStack_128 + lVar1) = 0x1653ce;
    memcpy(auStack_d8 + lVar1,pvVar8,unaff_R12);
    puVar9 = puStack_c0;
    *(undefined8 *)((long)&uStack_128 + lVar1) = 0x1653dc;
    Hacl_Hash_SHA2_hash_512(puVar9,input,uVar16);
    puStack_b8 = (uint64_t *)0x40;
    uStack_ac = 0x40;
  }
  uVar16 = (int)uVar7 - 1U >> 3;
  uVar19 = uVar16 - uStack_ac;
  __n = (ulong)uVar19;
  uVar20 = __n + 0xf & 0xfffffffffffffff0;
  __s = input + -uVar20;
  __s[-8] = 0xac;
  __s[-7] = 0x54;
  __s[-6] = 0x16;
  __s[-5] = 0;
  __s[-4] = 0;
  __s[-3] = 0;
  __s[-2] = 0;
  __s[-1] = 0;
  memset(__s,0,__n);
  __s[uVar19 + ~uVar17] = 1;
  uVar18 = uStack_d0;
  __s[-8] = 0xcb;
  __s[-7] = 0x54;
  __s[-6] = 0x16;
  __s[-5] = 0;
  __s[-4] = 0;
  __s[-3] = 0;
  __s[-2] = 0;
  __s[-1] = 0;
  memcpy(__s + (uVar19 + ~uVar17) + 1,pvStack_c8,uVar18);
  res = __s + -uVar20;
  res[-8] = 0xe1;
  res[-7] = 0x54;
  res[-6] = 0x16;
  res[-5] = 0;
  res[-4] = 0;
  res[-3] = 0;
  res[-2] = 0;
  res[-1] = 0;
  memset(res,0,__n);
  uVar2 = uStack_ac;
  puVar9 = puStack_c0;
  a_00 = (Spec_Hash_Definitions_hash_alg)uStack_d4;
  res[-8] = 0xfb;
  res[-7] = 0x54;
  res[-6] = 0x16;
  res[-5] = 0;
  res[-4] = 0;
  res[-3] = 0;
  res[-2] = 0;
  res[-1] = 0;
  mgf_hash(a_00,uVar2,puVar9,uVar19,res);
  if (uVar16 != uVar2) {
    uVar18 = 0;
    do {
      __s[uVar18] = __s[uVar18] ^ res[uVar18];
      uVar18 = uVar18 + 1;
    } while (__n != uVar18);
  }
  if ((uVar7 & 7) != 0) {
    *__s = *__s & (byte)(0xff >> (8 - ((byte)uVar7 & 7) & 0x1f));
  }
  res[-8] = 0x39;
  res[-7] = 0x55;
  res[-6] = 0x16;
  res[-5] = 0;
  res[-4] = 0;
  res[-3] = 0;
  res[-2] = 0;
  res[-1] = 0;
  memcpy(local_78[1],__s,__n);
  puVar15 = puStack_b8;
  puVar9 = puStack_c0;
  res[-8] = 0x4a;
  res[-7] = 0x55;
  res[-6] = 0x16;
  res[-5] = 0;
  res[-4] = 0;
  res[-3] = 0;
  res[-2] = 0;
  res[-1] = 0;
  pvVar8 = memcpy((void *)((long)local_78[1] + __n),puVar9,(size_t)puVar15);
  *(undefined1 *)((long)local_78[1] + (ulong)uVar16) = 0xbc;
  return SUB81(pvVar8,0);
}

Assistant:

bool
Hacl_RSAPSS_rsapss_sign(
  Spec_Hash_Definitions_hash_alg a,
  uint32_t modBits,
  uint32_t eBits,
  uint32_t dBits,
  uint64_t *skey,
  uint32_t saltLen,
  uint8_t *salt,
  uint32_t msgLen,
  uint8_t *msg,
  uint8_t *sgnt
)
{
  uint32_t hLen = hash_len(a);
  bool
  b = saltLen <= 0xffffffffU - hLen - 8U && saltLen + hLen + 2U <= (modBits - 1U - 1U) / 8U + 1U;
  if (b)
  {
    uint32_t nLen = (modBits - 1U) / 64U + 1U;
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen);
    uint64_t m[nLen];
    memset(m, 0U, nLen * sizeof (uint64_t));
    uint32_t emBits = modBits - 1U;
    uint32_t emLen = (emBits - 1U) / 8U + 1U;
    KRML_CHECK_SIZE(sizeof (uint8_t), emLen);
    uint8_t em[emLen];
    memset(em, 0U, emLen * sizeof (uint8_t));
    pss_encode(a, saltLen, salt, msgLen, msg, emBits, em);
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(emLen, em, m);
    uint32_t nLen1 = (modBits - 1U) / 64U + 1U;
    uint32_t k = (modBits - 1U) / 8U + 1U;
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen1);
    uint64_t s[nLen1];
    memset(s, 0U, nLen1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen1);
    uint64_t m_[nLen1];
    memset(m_, 0U, nLen1 * sizeof (uint64_t));
    uint32_t nLen2 = (modBits - 1U) / 64U + 1U;
    uint32_t eLen = (eBits - 1U) / 64U + 1U;
    uint64_t *n = skey;
    uint64_t *r2 = skey + nLen2;
    uint64_t *e = skey + nLen2 + nLen2;
    uint64_t *d = skey + nLen2 + nLen2 + eLen;
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64((modBits - 1U) / 64U + 1U,
      n,
      mu,
      r2,
      m,
      dBits,
      d,
      s);
    uint64_t mu0 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64((modBits - 1U) / 64U + 1U,
      n,
      mu0,
      r2,
      s,
      eBits,
      e,
      m_);
    uint64_t mask = 0xFFFFFFFFFFFFFFFFULL;
    for (uint32_t i = 0U; i < nLen2; i++)
    {
      uint64_t uu____0 = FStar_UInt64_eq_mask(m[i], m_[i]);
      mask = uu____0 & mask;
    }
    uint64_t mask1 = mask;
    uint64_t eq_m = mask1;
    for (uint32_t i = 0U; i < nLen2; i++)
    {
      uint64_t *os = s;
      uint64_t x = s[i];
      uint64_t x0 = eq_m & x;
      os[i] = x0;
    }
    bool eq_b = eq_m == 0xFFFFFFFFFFFFFFFFULL;
    Hacl_Bignum_Convert_bn_to_bytes_be_uint64(k, s, sgnt);
    bool eq_b0 = eq_b;
    return eq_b0;
  }
  return false;
}